

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONTestPresets.cxx
# Opt level: O3

bool anon_unknown.dwarf_bec9fe::TestPresetOptionalFilterIncludeIndexHelper
               (optional<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions> *out,
               Value *value,cmJSONState *state)

{
  bool bVar1;
  undefined1 uVar2;
  cmJSONState *local_48;
  String local_40;
  
  if (value == (Value *)0x0) {
    uVar2 = 1;
    if ((out->
        super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
        )._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
        .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
        ._M_engaged == true) {
      std::_Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::
      _M_destroy((_Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
                  *)out);
    }
  }
  else {
    bVar1 = Json::Value::isString(value);
    if (bVar1) {
      if ((out->
          super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
          )._M_payload.
          super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
          .
          super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
          ._M_engaged == true) {
        std::_Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>::
        _M_destroy((_Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
                    *)out);
      }
      (out->
      super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
      )._M_payload.
      super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
      .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>.
      _M_payload._M_value.IndexFile._M_dataplus._M_p = (pointer)0x0;
      (out->
      super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
      )._M_payload.
      super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
      .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>.
      _M_payload._M_value.IndexFile._M_string_length = 0;
      (out->
      super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
      )._M_payload.
      super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
      .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>.
      _M_payload._M_value.IndexFile.field_2._M_allocated_capacity = 0;
      *(undefined8 *)
       ((long)&(out->
               super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
               )._M_payload.
               super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
               .
               super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
               ._M_payload._M_value.IndexFile.field_2 + 8) = 0;
      *(pointer *)
       ((long)&(out->
               super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
               )._M_payload.
               super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
               .
               super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
               ._M_payload._M_value.SpecificTests.super__Vector_base<int,_std::allocator<int>_> + 8)
           = (pointer)0x0;
      *(pointer *)
       ((long)&(out->
               super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
               )._M_payload.
               super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
               .
               super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
               ._M_payload._M_value.SpecificTests.super__Vector_base<int,_std::allocator<int>_> +
       0x10) = (pointer)0x0;
      (out->
      super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
      )._M_payload.
      super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
      .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>.
      _M_payload._M_value.Stride.super__Optional_base<int,_true,_true>._M_payload =
           (_Optional_payload<int,_true,_true,_true>)0x0;
      *(undefined8 *)
       &(out->
        super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
        )._M_payload.
        super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
        .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
        ._M_payload._M_value.SpecificTests.super__Vector_base<int,_std::allocator<int>_>._M_impl = 0
      ;
      (out->
      super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
      )._M_payload.
      super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
      .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>.
      _M_payload._M_value.Start.super__Optional_base<int,_true,_true> =
           (_Optional_base<int,_true,_true>)0x0;
      (out->
      super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
      )._M_payload.
      super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
      .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>.
      _M_payload._M_value.End.super__Optional_base<int,_true,_true>._M_payload =
           (_Optional_payload<int,_true,_true,_true>)0x0;
      (out->
      super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
      )._M_payload.
      super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
      .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>.
      _M_payload._M_value.IndexFile._M_dataplus._M_p =
           (pointer)((long)&(out->
                            super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
                            )._M_payload.
                            super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
                            .
                            super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
                            ._M_payload + 0x40);
      (out->
      super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
      )._M_payload.
      super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
      .super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>.
      _M_engaged = true;
      Json::Value::asString_abi_cxx11_(&local_40,value);
      std::__cxx11::string::operator=
                ((string *)
                 &(out->
                  super__Optional_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_false,_false>
                  )._M_payload.
                  super__Optional_payload<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions,_true,_false,_false>
                  .
                  super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::IncludeOptions::IndexOptions>
                  ._M_payload._M_value.IndexFile,(string *)&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      uVar2 = 1;
    }
    else {
      bVar1 = Json::Value::isObject(value);
      if (bVar1) {
        local_48 = state;
        local_40._M_dataplus._M_p = (pointer)value;
        if ((anonymous_namespace)::TestPresetOptionalFilterIncludeIndexObjectHelper._16_8_ == 0) {
          std::__throw_bad_function_call();
        }
        uVar2 = (*(code *)(anonymous_namespace)::TestPresetOptionalFilterIncludeIndexObjectHelper.
                          _24_8_)((anonymous_namespace)::
                                  TestPresetOptionalFilterIncludeIndexObjectHelper,out,&local_40,
                                  &local_48);
      }
      else {
        uVar2 = 0;
      }
    }
  }
  return (bool)uVar2;
}

Assistant:

bool TestPresetOptionalFilterIncludeIndexHelper(
  cm::optional<TestPreset::IncludeOptions::IndexOptions>& out,
  const Json::Value* value, cmJSONState* state)
{
  if (!value) {
    out = cm::nullopt;
    return true;
  }

  if (value->isString()) {
    out.emplace();
    out->IndexFile = value->asString();
    return true;
  }

  if (value->isObject()) {
    return TestPresetOptionalFilterIncludeIndexObjectHelper(out, value, state);
  }

  return false;
}